

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS ref_metric_integrate2(ref_metric_integrand2 integrand,void *state,REF_DBL *integral)

{
  uint uVar1;
  double dStack_38;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL value;
  REF_DBL *pRStack_28;
  REF_INT i;
  REF_DBL *integral_local;
  void *state_local;
  ref_metric_integrand2 integrand_local;
  
  *integral = 0.0;
  value._4_4_ = 0;
  pRStack_28 = integral;
  integral_local = (REF_DBL *)state;
  state_local = integrand;
  while( true ) {
    if (nq2 <= value._4_4_) {
      return 0;
    }
    uVar1 = (*(code *)state_local)(integral_local,baryq2 + value._4_4_,&stack0xffffffffffffffc8);
    if (uVar1 != 0) break;
    *pRStack_28 = weightq2[value._4_4_] * dStack_38 + *pRStack_28;
    value._4_4_ = value._4_4_ + 1;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0xe74,
         "ref_metric_integrate2",(ulong)uVar1,"eval");
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_metric_integrate2(ref_metric_integrand2 integrand,
                                         void *state, REF_DBL *integral) {
  REF_INT i;
  REF_DBL value;
  *integral = 0.0;
  for (i = 0; i < nq2; i++) {
    RSS(integrand(state, baryq2[i], &value), "eval");
    *integral += weightq2[i] * value;
  }

  return REF_SUCCESS;
}